

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O1

void __thiscall rtc::Event::Event(Event *this,bool manual_reset,bool initially_signaled)

{
  int iVar1;
  ostream *poVar2;
  FatalMessage local_180;
  
  this->is_manual_reset_ = manual_reset;
  this->event_status_ = initially_signaled;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    iVar1 = pthread_cond_init((pthread_cond_t *)&this->event_cond_,(pthread_condattr_t *)0x0);
    if (iVar1 == 0) {
      return;
    }
    FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event.cc"
               ,0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_180,"Check failed: pthread_cond_init(&event_cond_, NULL) == 0",0x38
              );
    std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
    std::ostream::put((char)&local_180);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  }
  else {
    FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event.cc"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_180,"Check failed: pthread_mutex_init(&event_mutex_, NULL) == 0",
               0x3a);
    std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
    std::ostream::put((char)&local_180);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  }
  FatalMessage::~FatalMessage(&local_180);
}

Assistant:

Event::Event(bool manual_reset, bool initially_signaled)
    : is_manual_reset_(manual_reset),
      event_status_(initially_signaled) {
  RTC_CHECK(pthread_mutex_init(&event_mutex_, NULL) == 0);
  RTC_CHECK(pthread_cond_init(&event_cond_, NULL) == 0);
}